

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::DynamicMapField::SetMapIteratorValue
          (DynamicMapField *this,MapIterator *map_iter)

{
  long lVar1;
  
  lVar1 = *map_iter->iter_;
  if (lVar1 != 0) {
    MapKey::CopyFrom(&map_iter->key_,*(MapKey **)(lVar1 + 0x10));
    lVar1 = *(long *)(lVar1 + 0x10);
    (map_iter->value_).type_ = *(int *)(lVar1 + 0x18);
    (map_iter->value_).data_ = *(void **)(lVar1 + 0x10);
  }
  return;
}

Assistant:

void MapFieldBase::SyncMapWithRepeatedField() const {
  // "Acquire" insures the operation after SyncMapWithRepeatedField won't get
  // executed before state_ is checked.
  Atomic32 state = google::protobuf::internal::Acquire_Load(&state_);
  if (state == STATE_MODIFIED_REPEATED) {
    mutex_.Lock();
    // Double check state, because another thread may have seen the same state
    // and done the synchronization before the current thread.
    if (state_ == STATE_MODIFIED_REPEATED) {
      SyncMapWithRepeatedFieldNoLock();
      // "Release" insures state_ can only be changed "after"
      // SyncRepeatedFieldWithMapNoLock is finished.
      google::protobuf::internal::Release_Store(&state_, CLEAN);
    }
    mutex_.Unlock();
  }
}